

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLExtensions.cpp
# Opt level: O0

void sf::priv::ensureExtensionsInit(void)

{
  GLenum GVar1;
  byte *pbVar2;
  ostream *poVar3;
  GLubyte *version;
  int minorVersion;
  int majorVersion;
  GLint local_8;
  GLint local_4;
  
  if (!ensureExtensionsInit::initialized) {
    ensureExtensionsInit::initialized = true;
    gladLoadGL((GLADloadfunc)0x2dbf04);
    local_4 = 0;
    local_8 = 0;
    (*sf_glad_glGetIntegerv)(0x821b,&local_4);
    (*sf_glad_glGetIntegerv)(0x821c,&local_8);
    GVar1 = (*sf_glad_glGetError)();
    if (GVar1 == 0x500) {
      pbVar2 = (*sf_glad_glGetString)(0x1f02);
      if (pbVar2 == (byte *)0x0) {
        local_4 = 1;
        local_8 = 1;
      }
      else {
        local_4 = *pbVar2 - 0x30;
        local_8 = pbVar2[2] - 0x30;
      }
    }
    if ((local_4 < 1) || ((local_4 == 1 && (local_8 < 1)))) {
      poVar3 = err();
      poVar3 = std::operator<<(poVar3,"sfml-graphics requires support for OpenGL 1.1 or greater");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = err();
      poVar3 = std::operator<<(poVar3,"Ensure that hardware acceleration is enabled if available");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void ensureExtensionsInit()
{
    static bool initialized = false;
    if (!initialized)
    {
        initialized = true;

#ifdef SFML_OPENGL_ES
        gladLoadGLES1(reinterpret_cast<GLADloadfunc>(sf::Context::getFunction));
#else
        gladLoadGL(reinterpret_cast<GLADloadfunc>(sf::Context::getFunction));
#endif

        // Retrieve the context version number
        int majorVersion = 0;
        int minorVersion = 0;

        // Try the new way first
        glGetIntegerv(GL_MAJOR_VERSION, &majorVersion);
        glGetIntegerv(GL_MINOR_VERSION, &minorVersion);

        if (glGetError() == GL_INVALID_ENUM)
        {
            // Try the old way
            const GLubyte* version = glGetString(GL_VERSION);
            if (version)
            {
                // The beginning of the returned string is "major.minor" (this is standard)
                majorVersion = version[0] - '0';
                minorVersion = version[2] - '0';
            }
            else
            {
                // Can't get the version number, assume 1.1
                majorVersion = 1;
                minorVersion = 1;
            }
        }

        if ((majorVersion < 1) || ((majorVersion == 1) && (minorVersion < 1)))
        {
            err() << "sfml-graphics requires support for OpenGL 1.1 or greater" << std::endl;
            err() << "Ensure that hardware acceleration is enabled if available" << std::endl;
        }
    }
}